

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

shared_ptr<embree::Texture> __thiscall
embree::XMLLoader::loadTextureParm(XMLLoader *this,Ref<embree::XML> *xml)

{
  bool bVar1;
  int iVar2;
  Format FVar3;
  uint uVar4;
  uint uVar5;
  runtime_error *prVar6;
  void *pvVar7;
  element_type *peVar8;
  size_t sVar9;
  mapped_type *this_00;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<embree::Texture> sVar10;
  uint bytesPerTexel;
  Format format;
  uint height;
  uint width;
  FileName src;
  string id;
  shared_ptr<embree::Texture> *texture;
  Texture *in_stack_fffffffffffffc28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  undefined7 in_stack_fffffffffffffc38;
  undefined1 in_stack_fffffffffffffc3f;
  Format in_stack_fffffffffffffc40;
  char *in_stack_fffffffffffffc58;
  key_type *in_stack_fffffffffffffc68;
  Texture *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  FileName *in_stack_fffffffffffffc80;
  allocator *paVar11;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  FileName *in_stack_fffffffffffffc98;
  bool local_312;
  FileName *in_stack_fffffffffffffd38;
  string local_2c0 [55];
  undefined1 local_289;
  string local_268 [32];
  uint local_248;
  allocator local_241;
  string local_240 [32];
  string local_220 [32];
  Format local_200;
  allocator local_1f9;
  string local_1f8 [32];
  string local_1d8 [32];
  int local_1b8;
  allocator local_1b1;
  string local_1b0 [32];
  string local_190 [36];
  int local_16c;
  string local_138 [39];
  allocator local_111;
  string local_110 [32];
  string local_f0 [67];
  byte local_ad;
  undefined4 local_ac;
  _Self local_a8;
  _Self local_a0 [3];
  allocator local_81;
  string local_80 [32];
  string local_60 [32];
  undefined8 local_40;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_40 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"id",&local_81);
  XML::parm((XML *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
            (string *)in_stack_fffffffffffffc70);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  bVar1 = std::operator!=(in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28);
  local_312 = false;
  if (bVar1) {
    local_a0[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                 *)in_stack_fffffffffffffc28,(key_type *)0x388135);
    local_a8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                *)in_stack_fffffffffffffc28);
    local_312 = std::operator!=(local_a0,&local_a8);
  }
  if (local_312 == false) {
    local_ad = 0;
    std::shared_ptr<embree::Texture>::shared_ptr((shared_ptr<embree::Texture> *)0x388261);
    local_10 = local_40;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"src",&local_111);
    XML::parm((XML *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
              (string *)in_stack_fffffffffffffc70);
    embree::FileName::FileName
              (in_stack_fffffffffffffc80,
               (string *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    embree::FileName::str_abi_cxx11_((FileName *)in_stack_fffffffffffffc28);
    bVar1 = std::operator!=(in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28);
    std::__cxx11::string::~string(local_138);
    if (bVar1) {
      embree::FileName::operator+
                (in_stack_fffffffffffffc98,
                 (FileName *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      Texture::load(in_stack_fffffffffffffd38);
      std::shared_ptr<embree::Texture>::operator=
                ((shared_ptr<embree::Texture> *)in_stack_fffffffffffffc30,
                 (shared_ptr<embree::Texture> *)in_stack_fffffffffffffc28);
      std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x3883bd);
      embree::FileName::~FileName((FileName *)0x3883ca);
    }
    else {
      local_18 = local_40;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b0,"width",&local_1b1);
      XML::parm((XML *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                (string *)in_stack_fffffffffffffc70);
      iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffc30,(size_t *)in_stack_fffffffffffffc28,0);
      std::__cxx11::string::~string(local_190);
      std::__cxx11::string::~string(local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
      local_20 = local_40;
      paVar11 = &local_1f9;
      local_16c = iVar2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f8,"height",paVar11);
      XML::parm((XML *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                (string *)in_stack_fffffffffffffc70);
      iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffc30,(size_t *)in_stack_fffffffffffffc28,0);
      std::__cxx11::string::~string(local_1d8);
      std::__cxx11::string::~string(local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      local_28 = local_40;
      paVar11 = &local_241;
      local_1b8 = iVar2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_240,"format",paVar11);
      XML::parm((XML *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                (string *)in_stack_fffffffffffffc70);
      FVar3 = Texture::string_to_format
                        ((string *)CONCAT17(in_stack_fffffffffffffc3f,in_stack_fffffffffffffc38));
      std::__cxx11::string::~string(local_220);
      std::__cxx11::string::~string(local_240);
      std::allocator<char>::~allocator((allocator<char> *)&local_241);
      local_200 = FVar3;
      uVar4 = Texture::getFormatBytesPerTexel(in_stack_fffffffffffffc40);
      local_248 = uVar4;
      in_stack_fffffffffffffc70 = (Texture *)ftell(*(FILE **)(in_RSI + 0x20));
      if ((long)(*(ulong *)(in_RSI + 0x48) & 0xffffffff) <
          (long)((_Alloc_hider *)&in_stack_fffffffffffffc70->width +
                local_16c * local_1b8 * local_248)) {
        local_289 = 1;
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        embree::FileName::str_abi_cxx11_((FileName *)in_stack_fffffffffffffc28);
        std::operator+((char *)CONCAT44(FVar3,uVar4),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffc70);
        std::runtime_error::runtime_error(prVar6,local_268);
        local_289 = 0;
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pvVar7 = Texture::operator_new(0x388987);
      Texture::Texture(in_stack_fffffffffffffc70,(uint)((ulong)in_stack_fffffffffffffc68 >> 0x20),
                       (uint)in_stack_fffffffffffffc68,(Format)((ulong)pvVar7 >> 0x20),
                       in_stack_fffffffffffffc58);
      std::shared_ptr<embree::Texture>::shared_ptr<embree::Texture,void>
                ((shared_ptr<embree::Texture> *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28)
      ;
      std::shared_ptr<embree::Texture>::operator=
                ((shared_ptr<embree::Texture> *)in_stack_fffffffffffffc30,
                 (shared_ptr<embree::Texture> *)in_stack_fffffffffffffc28);
      std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x3889ec);
      uVar5 = local_16c * local_1b8;
      peVar8 = std::__shared_ptr_access<embree::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<embree::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x388a0f);
      sVar9 = fread(peVar8->data,(ulong)local_248,(ulong)(uint)(local_16c * local_1b8),
                    *(FILE **)(in_RSI + 0x20));
      if (uVar5 != sVar9) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        embree::FileName::str_abi_cxx11_((FileName *)in_stack_fffffffffffffc28);
        std::operator+((char *)CONCAT44(FVar3,uVar4),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffc70);
        std::runtime_error::runtime_error(prVar6,local_2c0);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    bVar1 = std::operator!=(in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28);
    if (bVar1) {
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                              *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      std::shared_ptr<embree::Texture>::operator=
                (this_00,(shared_ptr<embree::Texture> *)in_stack_fffffffffffffc28);
    }
    local_ad = 1;
    local_ac = 1;
    embree::FileName::~FileName((FileName *)0x388bfd);
    if ((local_ad & 1) == 0) {
      std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x388c25);
    }
  }
  else {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                  *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    std::shared_ptr<embree::Texture>::shared_ptr
              ((shared_ptr<embree::Texture> *)in_stack_fffffffffffffc30,
               (shared_ptr<embree::Texture> *)in_stack_fffffffffffffc28);
    local_ac = 1;
  }
  std::__cxx11::string::~string(local_60);
  sVar10.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar10.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<embree::Texture>)
         sVar10.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Texture> XMLLoader::loadTextureParm(const Ref<XML>& xml)
  {
    const std::string id = xml->parm("id");
    if (id != "" && state.textureMap.find(id) != state.textureMap.end())
      return state.textureMap[id];

    std::shared_ptr<Texture> texture;
    const FileName src = xml->parm("src");

    /*! load texture from file */
    if (src.str() != "") {
      texture = Texture::load(path+src);
    }

    /*! load texture from binary file */
    else {
      const unsigned width  = stoi(xml->parm("width"));
      const unsigned height = stoi(xml->parm("height"));
      const Texture::Format format = Texture::string_to_format(xml->parm("format"));
      const unsigned bytesPerTexel = Texture::getFormatBytesPerTexel(format);
      if (ftell(binFile) + width*height*bytesPerTexel > (unsigned)binFileSize)
        THROW_RUNTIME_ERROR("error reading from binary file: "+binFileName.str());
      
      //texture = std::make_shared<Texture>(width,height,format);
      texture = std::shared_ptr<Texture>(new Texture(width,height,format));
      if (width*height != fread(texture->data, bytesPerTexel, width*height, binFile)) 
        THROW_RUNTIME_ERROR("error reading from binary file: "+binFileName.str());
    }
    
    if (id != "") state.textureMap[id] = texture;
    return texture;
  }